

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemZModule.c
# Opt level: O2

cs_err SystemZ_global_init(cs_struct *ud)

{
  MCRegisterInfo *MRI;
  
  MRI = (MCRegisterInfo *)(*cs_mem_malloc)(0x58);
  SystemZ_init(MRI);
  ud->printer = SystemZ_printInst;
  ud->printer_info = MRI;
  ud->getinsn_info = MRI;
  ud->disasm = SystemZ_getInstruction;
  ud->post_printer = SystemZ_post_printer;
  ud->reg_name = SystemZ_reg_name;
  ud->insn_id = SystemZ_get_insn_id;
  ud->insn_name = SystemZ_insn_name;
  ud->group_name = SystemZ_group_name;
  return CS_ERR_OK;
}

Assistant:

cs_err SystemZ_global_init(cs_struct *ud)
{
	MCRegisterInfo *mri;
	mri = cs_mem_malloc(sizeof(*mri));

	SystemZ_init(mri);
	ud->printer = SystemZ_printInst;
	ud->printer_info = mri;
	ud->getinsn_info = mri;
	ud->disasm = SystemZ_getInstruction;
	ud->post_printer = SystemZ_post_printer;

	ud->reg_name = SystemZ_reg_name;
	ud->insn_id = SystemZ_get_insn_id;
	ud->insn_name = SystemZ_insn_name;
	ud->group_name = SystemZ_group_name;

	return CS_ERR_OK;
}